

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

char GetBestLacingType(matroska_block *Element,int ForProfile)

{
  int *piVar1;
  ebml_master *peVar2;
  MatroskaContentEncodingScope MVar3;
  MatroskaTrackEncodingCompAlgo MVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ebml_context *peVar8;
  ebml_master *peVar9;
  ebml_integer *peVar10;
  int64_t iVar11;
  ulong uVar12;
  filepos_t fVar13;
  ulong uVar14;
  int iVar15;
  char cVar16;
  int iVar17;
  uint uVar18;
  MatroskaContentEncodingScope local_48;
  MatroskaTrackEncodingCompAlgo local_40;
  
  uVar7 = (Element->SizeList)._Used;
  if (uVar7 < 8) {
LAB_0010b3da:
    cVar16 = '\0';
  }
  else {
    piVar1 = (int *)(Element->SizeList)._Begin;
    iVar15 = *piVar1;
    uVar7 = uVar7 >> 2;
    for (uVar14 = 1; cVar16 = '\x02', uVar7 != uVar14; uVar14 = uVar14 + 1) {
      if (piVar1[uVar14] != iVar15) {
        if (uVar7 == uVar14) {
          return '\x02';
        }
        peVar9 = Element->WriteTrack;
        if (peVar9 == (ebml_master *)0x0) {
          __assert_fail("Element->WriteTrack!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x662,"char GetBestLacingType(const matroska_block *, int)");
        }
        peVar8 = MATROSKA_getContextContentEncodings();
        peVar9 = (ebml_master *)EBML_MasterFindFirstElt(peVar9,peVar8,0,0,0);
        local_48 = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
        MVar3 = local_48;
        local_48 = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
        local_40 = MATROSKA_TRACK_ENCODING_COMP_NONE;
        MVar4 = local_40;
        local_40 = MATROSKA_TRACK_ENCODING_COMP_NONE;
        if (peVar9 == (ebml_master *)0x0) {
          peVar10 = (ebml_integer *)0x0;
          local_40 = MVar4;
          local_48 = MVar3;
        }
        else {
          peVar8 = MATROSKA_getContextContentEncoding();
          peVar10 = (ebml_integer *)0x0;
          peVar9 = (ebml_master *)EBML_MasterFindFirstElt(peVar9,peVar8,0,0,0);
          if ((peVar9->Base).Base.Children != (nodetree *)0x0) {
            peVar2 = (ebml_master *)(peVar9->Base).Base.Next;
            if (peVar9 == peVar2) {
              __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x669,"char GetBestLacingType(const matroska_block *, int)");
            }
            if (peVar2 != (ebml_master *)0x0) goto LAB_0010b3da;
            peVar8 = MATROSKA_getContextContentEncodingScope();
            peVar10 = (ebml_integer *)EBML_MasterFindFirstElt(peVar9,peVar8,0,0,0);
            if (peVar10 == (ebml_integer *)0x0) {
              local_48 = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
            }
            else {
              iVar11 = EBML_IntegerValue(peVar10);
              local_48 = (MatroskaContentEncodingScope)iVar11;
            }
            peVar8 = MATROSKA_getContextContentCompression();
            peVar9 = (ebml_master *)EBML_MasterFindFirstElt(peVar9,peVar8,0,0,0);
            if (peVar9 == (ebml_master *)0x0) {
              return '\0';
            }
            peVar8 = MATROSKA_getContextContentCompAlgo();
            peVar10 = (ebml_integer *)EBML_MasterFindFirstElt(peVar9,peVar8,1,1,ForProfile);
            if (peVar10 == (ebml_integer *)0x0) goto LAB_0010b3da;
            iVar11 = EBML_IntegerValue(peVar10);
            local_40 = (MatroskaTrackEncodingCompAlgo)iVar11;
            if ((local_40 != MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP) &&
               (local_40 != MATROSKA_TRACK_ENCODING_COMP_ZLIB)) goto LAB_0010b3da;
            iVar11 = EBML_IntegerValue(peVar10);
            if (iVar11 == 3) {
              peVar8 = MATROSKA_getContextContentCompSettings();
              peVar10 = (ebml_integer *)EBML_MasterFindFirstElt(peVar9,peVar8,0,0,0);
            }
          }
        }
        iVar17 = 0;
        for (uVar7 = 0; uVar7 < ((Element->SizeList)._Used >> 2) - 1; uVar7 = uVar7 + 1) {
          uVar14 = GetBlockFrameSize(Element,uVar7,&peVar10->Base,local_40,local_48);
          uVar12 = 0xfe;
          if (0xfe < (int)uVar14) {
            uVar12 = uVar14 & 0xffffffff;
          }
          iVar6 = (int)(uVar12 / 0xff);
          iVar15 = iVar6 * -0xff + (int)uVar14;
          iVar17 = iVar17 + iVar6 + 1;
        }
        fVar13 = GetBlockFrameSize(Element,0,&peVar10->Base,local_40,local_48);
        bVar5 = EBML_CodedSizeLength(fVar13,'\0',1);
        uVar18 = (uint)bVar5;
        for (uVar7 = 1; uVar7 < ((Element->SizeList)._Used >> 2) - 1; uVar7 = uVar7 + 1) {
          fVar13 = GetBlockFrameSize(Element,uVar7,&peVar10->Base,local_40,local_48);
          iVar15 = (int)fVar13 - iVar15;
          bVar5 = EBML_CodedSizeLengthSigned((long)iVar15,'\0');
          uVar18 = uVar18 + bVar5;
        }
        return ((int)uVar18 <= iVar17) * '\x02' + '\x01';
      }
    }
  }
  return cVar16;
}

Assistant:

static char GetBestLacingType(const matroska_block *Element, int ForProfile)
{
    int XiphLacingSize, EbmlLacingSize;
    size_t i;
    int32_t DataSize;
    ebml_element *Elt, *Elt2, *Header = NULL;
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;

    if (ARRAYCOUNT(Element->SizeList,int32_t) <= 1)
        return LACING_NONE;

    DataSize = ARRAYBEGIN(Element->SizeList,int32_t)[0];
    for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t);++i)
    {
        if (ARRAYBEGIN(Element->SizeList,int32_t)[i]!=DataSize)
            break;
    }
    if (i==ARRAYCOUNT(Element->SizeList,int32_t))
        return LACING_FIXED;

    // find out if compressed headers are used
    assert(Element->WriteTrack!=NULL);
    Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return 0; // TODO support cascaded compression/encryption

            Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
            if (Elt2)
                CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return 0; // TODO: support encryption

            Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
            if (Header)
                CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
            bool_t CanCompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanCompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanCompress = 1;
#endif
            if (!CanCompress)
                return 0;

            if (EBML_IntegerValue((ebml_integer*)Header)==MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
        }
    }

    XiphLacingSize = 0;
    for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
    {
        DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
        while (DataSize >= 0xFF)
        {
            XiphLacingSize++;
            DataSize -= 0xFF;
        }
        XiphLacingSize++;
    }

    EbmlLacingSize = EBML_CodedSizeLength(GetBlockFrameSize(Element, 0, Header, CompressionAlgo, CompressionScope),0,1);
    for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
    {
        DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope) - DataSize;
        EbmlLacingSize += EBML_CodedSizeLengthSigned(DataSize,0);
    }

    if (XiphLacingSize < EbmlLacingSize)
        return LACING_XIPH;
    else
        return LACING_EBML;
}